

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O1

GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
* __thiscall
rapidjson::
GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
::ParseStream<0u,rapidjson::UTF8<char>,rapidjson::GenericStringStream<rapidjson::UTF8<char>>>
          (GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
           *this,GenericStringStream<rapidjson::UTF8<char>_> *is)

{
  GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
  *pGVar1;
  undefined2 uVar2;
  undefined4 uVar3;
  long lVar4;
  undefined8 uVar5;
  ParseResult PVar6;
  ClearStackOnExit scope;
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator> reader;
  ClearStackOnExit local_58;
  Stack<rapidjson::CrtAllocator> local_50;
  undefined4 local_20;
  undefined8 local_18;
  undefined4 local_10;
  
  local_50.allocator_ = *(CrtAllocator **)(this + 0x20);
  local_50.ownAllocator_ = (CrtAllocator *)0x0;
  local_50.stack_ = (char *)0x0;
  local_50.stackTop_ = (char *)0x0;
  local_50.stackEnd_ = (char *)0x0;
  local_50.initialCapacity_ = 0x100;
  local_20 = 0;
  local_18 = 0;
  local_10 = 2;
  local_58.d_ = (GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                 *)this;
  PVar6 = GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
          Parse<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                    ((GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>
                      *)&local_50,is,
                     (GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                      *)this);
  *(ParseErrorCode *)(this + 0x50) = PVar6.code_;
  *(size_t *)(this + 0x58) = PVar6.offset_;
  if (PVar6.code_ == kParseErrorNone) {
    lVar4 = *(long *)(this + 0x38);
    if (lVar4 - *(long *)(this + 0x30) != 0x10) {
      __assert_fail("stack_.GetSize() == sizeof(ValueType)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/document.h"
                    ,0xa59,
                    "GenericDocument<Encoding, Allocator, StackAllocator> &rapidjson::GenericDocument<rapidjson::UTF8<>>::ParseStream(InputStream &) [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, SourceEncoding = rapidjson::UTF8<>, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>]"
                   );
    }
    pGVar1 = (GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
              *)(lVar4 + -0x10);
    *(GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
      **)(this + 0x38) = pGVar1;
    if (pGVar1 != this) {
      uVar2 = *(undefined2 *)(lVar4 + -2);
      *(undefined2 *)(lVar4 + -2) = 0;
      uVar5 = *(undefined8 *)pGVar1;
      uVar3 = *(undefined4 *)(lVar4 + -8);
      *(undefined2 *)(this + 0xc) = *(undefined2 *)(lVar4 + -4);
      *(undefined4 *)(this + 8) = uVar3;
      *(undefined8 *)this = uVar5;
      *(undefined2 *)(this + 0xe) = uVar2;
    }
  }
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::ClearStackOnExit::~ClearStackOnExit(&local_58);
  internal::Stack<rapidjson::CrtAllocator>::Destroy(&local_50);
  return (GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *)this;
}

Assistant:

GenericDocument& ParseStream(InputStream& is) {
        GenericReader<SourceEncoding, Encoding, StackAllocator> reader(
            stack_.HasAllocator() ? &stack_.GetAllocator() : 0);
        ClearStackOnExit scope(*this);
        parseResult_ = reader.template Parse<parseFlags>(is, *this);
        if (parseResult_) {
            RAPIDJSON_ASSERT(stack_.GetSize() == sizeof(ValueType)); // Got one and only one root object
            ValueType::operator=(*stack_.template Pop<ValueType>(1));// Move value from stack to document
        }
        return *this;
    }